

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O0

int dsSet(dsCrate *crate)

{
  int iVar1;
  dsCrate *crate_local;
  
  pthread_once(&keyOnce,makeKey);
  iVar1 = pthread_setspecific(key,crate);
  if (iVar1 < 0) {
    dsRunLogCallback("%s(): Can\'t set pthread specific.\n","dsSet");
    crate_local._4_4_ = -1;
  }
  else {
    crate_local._4_4_ = 0;
  }
  return crate_local._4_4_;
}

Assistant:

int
dsSet(dsCrate *crate)
{
	/*
	 * Set thread specific crate handle.
	 */
	pthread_once(&keyOnce, makeKey);
	if (pthread_setspecific(key, crate) < 0) {
		dsLog("Can't set pthread specific.\n");
		return -1;
	}

	return 0;
}